

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O0

Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* anon_unknown.dwarf_629e3::Shader::create
            (Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,GLuint kind,string *src)

{
  bool bVar1;
  int iVar2;
  const_iterator __first;
  const_iterator pvVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  Shader local_90c;
  string local_908;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8e8;
  string local_8c8;
  int local_8a4;
  size_type sStack_8a0;
  int add;
  size_t line_end;
  undefined1 auStack_890 [4];
  int i;
  string_view sv;
  int local_878;
  int pos;
  int line;
  int mod;
  int context;
  allocator<char> local_859;
  string local_858 [8];
  string error_string;
  char info [2048];
  GLsizei length;
  GLint compiled;
  GLchar *c_src;
  string *psStack_20;
  GLuint name;
  string *src_local;
  Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pEStack_10;
  GLuint kind_local;
  
  psStack_20 = src;
  src_local._4_4_ = kind;
  pEStack_10 = __return_storage_ptr__;
  c_src._4_4_ = glCreateShader(kind);
  _length = std::__cxx11::string::c_str();
  glShaderSource(c_src._4_4_,1,&length,0);
  glCompileShader(c_src._4_4_);
  info[0x7fc] = '\0';
  info[0x7fd] = '\0';
  info[0x7fe] = '\0';
  info[0x7ff] = '\0';
  glGetShaderiv(c_src._4_4_,0x8b81,info + 0x7fc);
  if (info._2044_4_ == 1) {
    Shader(&local_90c,c_src._4_4_);
    Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_90c);
    ~Shader(&local_90c);
  }
  else {
    info[0x7f8] = '\0';
    info[0x7f9] = '\0';
    info[0x7fa] = '\0';
    info[0x7fb] = '\0';
    glGetShaderInfoLog(c_src._4_4_,0x800,info + 0x7f8);
    glDeleteShader(c_src._4_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_858,error_string.field_2._M_local_buf + 8,&local_859);
    std::allocator<char>::~allocator(&local_859);
    line = 3;
    iVar2 = __isoc99_sscanf((undefined1 *)((long)&error_string.field_2 + 8),"%d:%d(%d)",&pos,
                            &local_878,(undefined1 *)((long)&sv._M_str + 4));
    if (iVar2 == 3) {
      auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_20);
      line_end._4_4_ = 1;
      while( true ) {
        sv._M_len = auVar5._8_8_;
        _auStack_890 = auVar5._0_8_;
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_890);
        if (bVar1 || local_878 + 3 <= (int)line_end._4_4_) break;
        sStack_8a0 = std::basic_string_view<char,_std::char_traits<char>_>::find
                               ((basic_string_view<char,_std::char_traits<char>_> *)auStack_890,"\n"
                                ,0);
        local_8a4 = 0;
        if (sStack_8a0 == 0xffffffffffffffff) {
          sStack_8a0 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                 ((basic_string_view<char,_std::char_traits<char>_> *)auStack_890);
        }
        else {
          local_8a4 = 1;
        }
        if (local_878 + -3 <= (int)line_end._4_4_) {
          format_abi_cxx11_(&local_8c8,"\n%d: ",(ulong)line_end._4_4_);
          std::__cxx11::string::operator+=(local_858,(string *)&local_8c8);
          std::__cxx11::string::~string((string *)&local_8c8);
          __first = std::basic_string_view<char,_std::char_traits<char>_>::begin
                              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_890);
          pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                             ((basic_string_view<char,_std::char_traits<char>_> *)auStack_890);
          std::__cxx11::string::append<char_const*,void>(local_858,__first,pvVar3 + sStack_8a0);
        }
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_890,
                   sStack_8a0 + (long)local_8a4);
        auVar5._8_8_ = sv._M_len;
        auVar5._0_8_ = _auStack_890;
        line_end._4_4_ = line_end._4_4_ + 1;
      }
    }
    uVar4 = std::__cxx11::string::c_str();
    format_abi_cxx11_(&local_908,"Shader compilation error: %s",uVar4);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Unexpected(&local_8e8,&local_908);
    Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_8e8);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected(&local_8e8);
    std::__cxx11::string::~string((string *)&local_908);
    std::__cxx11::string::~string(local_858);
  }
  return __return_storage_ptr__;
}

Assistant:

static Expected<Shader,std::string> create(GLuint kind, const std::string& src) {
		GLuint name = glCreateShader(kind);
		GLchar const * const c_src = src.c_str();
		glShaderSource(name, 1, (const GLchar**)&c_src, nullptr);
		glCompileShader(name);

		GLint compiled = GL_FALSE;
		glGetShaderiv(name, GL_COMPILE_STATUS, &compiled);
		if (compiled != GL_TRUE) {
			GLsizei length = 0;
			char info[2048];
			glGetShaderInfoLog(name, COUNTOF(info), &length, info);
			glDeleteShader(name);

			std::string error_string = info;

			const int context = 3;
			int mod, line, pos;
			if (3 == sscanf(info, "%d:%d(%d)", &mod, &line, &pos)) {
				std::string_view sv(src);
				for (int i = 1; !sv.empty() && i < line + context; ++i) {
					size_t line_end = sv.find("\n");
					int add = 0;

					if (line_end == std::string::npos)
						line_end = sv.size();
					else add = 1;

					if (i >= line - context) {
						error_string += format("\n%d: ", i);
						error_string.append(sv.begin(), sv.begin() + line_end);
					}

					sv.remove_prefix(line_end + add);
				}
			} else {
				//error_string = src;
			}

			return Unexpected(format("Shader compilation error: %s", error_string.c_str()));
		}

		return Shader(name);
	}